

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gazetteer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::CoreMLModels::Gazetteer::Gazetteer(Gazetteer *this)

{
  Gazetteer *pGVar1;
  Gazetteer *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Gazetteer_00d5eed0;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  ClassLabelsUnion::ClassLabelsUnion((ClassLabelsUnion *)&this->ClassLabels_);
  pGVar1 = internal_default_instance();
  if (this != pGVar1) {
    protobuf_Gazetteer_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

Gazetteer::Gazetteer()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_Gazetteer_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.CoreMLModels.Gazetteer)
}